

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O1

void roguejoin(level *lev,int x1,int y1,int x2,int y2,int horiz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  schar *psVar6;
  int iVar7;
  
  uVar3 = mt_random();
  if (horiz == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = CONCAT44(0,uVar3);
    iVar7 = SUB164(auVar2 % SEXT816((long)((y2 - y1) + 1)),0);
    iVar4 = iVar7 + y1;
    iVar5 = iVar4;
    if (iVar4 < y1) {
      iVar5 = y1;
    }
    psVar6 = &lev->locations[x1][y1].typ;
    iVar5 = (iVar5 - y1) + 1;
    do {
      *psVar6 = '\x18';
      psVar6 = psVar6 + 0xc;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    iVar5 = x2;
    if (x1 < x2) {
      iVar5 = x1;
    }
    psVar6 = &lev->locations[iVar5][iVar4].typ;
    iVar5 = x1 + x2 + iVar5 * -2 + 1;
    do {
      *psVar6 = '\x18';
      psVar6 = psVar6 + 0xfc;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if (y2 < iVar4) {
      iVar4 = y2;
    }
    psVar6 = &lev->locations[x2][iVar4].typ;
    iVar7 = y1 + y2 + iVar7 + iVar4 * -2 + 1;
    do {
      *psVar6 = '\x18';
      psVar6 = psVar6 + 0xc;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = CONCAT44(0,uVar3);
    iVar7 = SUB164(auVar1 % SEXT816((long)((x2 - x1) + 1)),0);
    iVar4 = iVar7 + x1;
    iVar5 = iVar4;
    if (iVar4 < x1) {
      iVar5 = x1;
    }
    psVar6 = &lev->locations[x1][y1].typ;
    iVar5 = (iVar5 - x1) + 1;
    do {
      *psVar6 = '\x18';
      psVar6 = psVar6 + 0xfc;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    iVar5 = y2;
    if (y1 < y2) {
      iVar5 = y1;
    }
    psVar6 = &lev->locations[iVar4][iVar5].typ;
    iVar5 = y1 + y2 + iVar5 * -2 + 1;
    do {
      *psVar6 = '\x18';
      psVar6 = psVar6 + 0xc;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if (x2 < iVar4) {
      iVar4 = x2;
    }
    psVar6 = &lev->locations[iVar4][y2].typ;
    iVar7 = x1 + x2 + iVar7 + iVar4 * -2 + 1;
    do {
      *psVar6 = '\x18';
      psVar6 = psVar6 + 0xfc;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return;
}

Assistant:

static void roguejoin(struct level *lev, int x1, int y1, int x2, int y2, int horiz)
{
	int x,y,middle;
#ifndef MAX
#define MAX(a,b) (((a) > (b)) ? (a) : (b))
#endif
#ifndef MIN
#define MIN(a,b) (((a) < (b)) ? (a) : (b))
#endif
	if (horiz) {
		middle = x1 + rn2(x2-x1+1);
		for (x=MIN(x1,middle); x<=MAX(x1,middle); x++)
			corr(lev, x, y1);
		for (y=MIN(y1,y2); y<=MAX(y1,y2); y++)
			corr(lev, middle,y);
		for (x=MIN(middle,x2); x<=MAX(middle,x2); x++)
			corr(lev, x, y2);
	} else {
		middle = y1 + rn2(y2-y1+1);
		for (y=MIN(y1,middle); y<=MAX(y1,middle); y++)
			corr(lev, x1, y);
		for (x=MIN(x1,x2); x<=MAX(x1,x2); x++)
			corr(lev, x, middle);
		for (y=MIN(middle,y2); y<=MAX(middle,y2); y++)
			corr(lev, x2,y);
	}
}